

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O0

int raw_exitcode(Backend *be)

{
  Raw *raw;
  Backend *be_local;
  
  if (be[-5].vt == (BackendVtable *)0x0) {
    if (((ulong)be[-5].interactor & 1) == 0) {
      be_local._4_4_ = 0;
    }
    else {
      be_local._4_4_ = 0x7fffffff;
    }
  }
  else {
    be_local._4_4_ = -1;
  }
  return be_local._4_4_;
}

Assistant:

static int raw_exitcode(Backend *be)
{
    Raw *raw = container_of(be, Raw, backend);
    if (raw->s != NULL)
        return -1;                     /* still connected */
    else if (raw->closed_on_socket_error)
        return INT_MAX;     /* a socket error counts as an unclean exit */
    else
        /* Exit codes are a meaningless concept in the Raw protocol */
        return 0;
}